

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O0

int compareXDBAtomRecs(void *avptr,void *bvptr)

{
  long lVar1;
  long lVar2;
  int iVar3;
  double dVar4;
  int local_3c;
  int t;
  int cmpval;
  atom *b;
  atom *a;
  xformAtomRecords **br;
  xformAtomRecords **ar;
  void *bvptr_local;
  void *avptr_local;
  
  lVar1 = *(long *)(*avptr + 8);
  lVar2 = *(long *)(*bvptr + 8);
  iVar3 = strcmp((char *)(*(long *)(lVar1 + 0x70) + 0x3b),(char *)(*(long *)(lVar2 + 0x70) + 0x3b));
  if (iVar3 < 1) {
    iVar3 = strcmp((char *)(*(long *)(lVar1 + 0x70) + 0x3b),(char *)(*(long *)(lVar2 + 0x70) + 0x3b)
                  );
    if (iVar3 < 0) {
      local_3c = -1;
    }
    else if (*(int *)(*(long *)(lVar2 + 0x70) + 0x20) < *(int *)(*(long *)(lVar1 + 0x70) + 0x20)) {
      local_3c = 1;
    }
    else if (*(int *)(*(long *)(lVar1 + 0x70) + 0x20) < *(int *)(*(long *)(lVar2 + 0x70) + 0x20)) {
      local_3c = -1;
    }
    else if (*(char *)(*(long *)(lVar2 + 0x70) + 0x3a) < *(char *)(*(long *)(lVar1 + 0x70) + 0x3a))
    {
      local_3c = 1;
    }
    else if (*(char *)(*(long *)(lVar1 + 0x70) + 0x3a) < *(char *)(*(long *)(lVar2 + 0x70) + 0x3a))
    {
      local_3c = -1;
    }
    else if (*(char *)(lVar2 + 0x7a) < *(char *)(lVar1 + 0x7a)) {
      local_3c = 1;
    }
    else if (*(char *)(lVar1 + 0x7a) < *(char *)(lVar2 + 0x7a)) {
      local_3c = -1;
    }
    else {
      local_3c = strcmp((char *)(lVar1 + 0x78),(char *)(lVar2 + 0x78));
      if (local_3c == 0) {
        if (*(char *)(lVar2 + 0x7d) < *(char *)(lVar1 + 0x7d)) {
          local_3c = 1;
        }
        else if (*(char *)(lVar1 + 0x7d) < *(char *)(lVar2 + 0x7d)) {
          local_3c = -1;
        }
        else {
          dVar4 = *(double *)(lVar1 + 0x38) - 0.001;
          if (dVar4 < *(double *)(lVar2 + 0x38) || dVar4 == *(double *)(lVar2 + 0x38)) {
            if (*(double *)(lVar2 + 0x38) <= *(double *)(lVar1 + 0x38) + 0.001) {
              dVar4 = *(double *)(lVar1 + 0x40) - 0.001;
              if (dVar4 < *(double *)(lVar2 + 0x40) || dVar4 == *(double *)(lVar2 + 0x40)) {
                if (*(double *)(lVar2 + 0x40) <= *(double *)(lVar1 + 0x40) + 0.001) {
                  dVar4 = *(double *)(lVar1 + 0x48) - 0.001;
                  if (dVar4 < *(double *)(lVar2 + 0x48) || dVar4 == *(double *)(lVar2 + 0x48)) {
                    if (*(double *)(lVar2 + 0x48) <= *(double *)(lVar1 + 0x48) + 0.001) {
                      note("atom duplicated in autobondrot input");
                      local_3c = 0;
                    }
                    else {
                      local_3c = -1;
                    }
                  }
                  else {
                    local_3c = 1;
                  }
                }
                else {
                  local_3c = -1;
                }
              }
              else {
                local_3c = 1;
              }
            }
            else {
              local_3c = -1;
            }
          }
          else {
            local_3c = 1;
          }
        }
      }
    }
  }
  else {
    local_3c = 1;
  }
  return -local_3c;
}

Assistant:

int compareXDBAtomRecs(const void *avptr, const void* bvptr) {
   xformAtomRecords **ar = (xformAtomRecords **)avptr;
   xformAtomRecords **br = (xformAtomRecords **)bvptr;
   atom *a = NULL, *b = NULL;
   int cmpval = 0, t = 0;

   a = ar[0]->a;
   b = br[0]->a;
   
   /* Divide into separate residues. Atom sorting within a residue is less important. */

   if      (strcmp(a->r->chain, b->r->chain) > 0) { cmpval =  1; }
   else if (strcmp(a->r->chain, b->r->chain) < 0) { cmpval = -1; }
   else {
      if      (a->r->resid > b->r->resid) { cmpval =  1; }
      else if (a->r->resid < b->r->resid) { cmpval = -1; }
      else {
	 if      (a->r->resInsCode > b->r->resInsCode) { cmpval =  1; }
	 else if (a->r->resInsCode < b->r->resInsCode) { cmpval = -1; }
	 else {
	    if      (a->atomname[2] > b->atomname[2]) { cmpval =  1; }
	    else if (a->atomname[2] < b->atomname[2]) { cmpval = -1; }
	    else {
	       t = strcmp(a->atomname, b->atomname);
	       if (t != 0) { cmpval = t; }
	       else {
		  if      (a->altConf > b->altConf) { cmpval =  1; }
		  else if (a->altConf < b->altConf) { cmpval = -1; }
		  else {
		     if      (a->loc.x - 0.001 > b->loc.x) { cmpval =  1; }
		     else if (a->loc.x + 0.001 < b->loc.x) { cmpval = -1; }
		     else {
			if      (a->loc.y - 0.001 > b->loc.y) { cmpval =  1; }
			else if (a->loc.y + 0.001 < b->loc.y) { cmpval = -1; }
			else {
			   if      (a->loc.z - 0.001 > b->loc.z) { cmpval =  1; }
			   else if (a->loc.z + 0.001 < b->loc.z) { cmpval = -1; }
			   else {
			      /* records seem to have the same name and position */

			      note("atom duplicated in autobondrot input");

			      cmpval = 0;
			   }
			}
		     }
		  }
	       }
	    }
	 }
      }
   }

   return -cmpval; /* invert sort order because the list will be built "CONSed" (appended) */
}